

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O1

void __thiscall Js::SourceDynamicProfileManager::Reuse(SourceDynamicProfileManager *this)

{
  BVFixed *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->dataCacheWrapper).ptr != (SimpleDataCacheWrapper *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x57,"(dataCacheWrapper == nullptr)",
                                "Persisted profiles cannot be re-used");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pBVar1 = (this->startupFunctions).ptr;
  Memory::Recycler::WBSetBit((char *)&this->cachedStartupFunctions);
  (this->cachedStartupFunctions).ptr = pBVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->cachedStartupFunctions);
  return;
}

Assistant:

void SourceDynamicProfileManager::Reuse()
    {
        AssertMsg(dataCacheWrapper == nullptr, "Persisted profiles cannot be re-used");
        cachedStartupFunctions = startupFunctions;
    }